

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

HttpRanges * __thiscall
kj::tryParseHttpRangeHeader
          (HttpRanges *__return_storage_ptr__,kj *this,ArrayPtr<const_char> value,
          uint64_t contentLength)

{
  kj *pkVar1;
  kj kVar2;
  bool bVar3;
  RemoveConst<kj::HttpByteRange> *pRVar4;
  HttpByteRange *pHVar5;
  ulong uVar6;
  kj *pkVar7;
  kj kVar8;
  uint uVar9;
  uint uVar10;
  kj *pkVar11;
  kj *pkVar12;
  uint uVar13;
  size_t newSize;
  HttpByteRange *pHVar14;
  kj *pkVar15;
  uint uVar16;
  ulong uVar17;
  kj *pkVar18;
  ulong uVar19;
  ulong uVar20;
  Vector<kj::HttpByteRange> satisfiableRanges;
  Vector<kj::HttpByteRange> local_78;
  ulong local_58;
  char *local_50;
  Array<kj::HttpByteRange> local_48;
  
  uVar6 = value.size_;
  local_50 = value.ptr;
  pkVar12 = this + 5;
  do {
    kVar2 = pkVar12[-5];
    if ((byte)kVar2 < 0x20) {
      if (kVar2 != (kj)0x9) goto LAB_003e9d29;
    }
    else if (kVar2 != (kj)0x20) break;
    pkVar12 = pkVar12 + 1;
  } while( true );
  if (((((kVar2 == (kj)0x42) || (kVar2 == (kj)0x62)) && (((byte)pkVar12[-4] | 0x20) == 0x79)) &&
      ((((byte)pkVar12[-3] | 0x20) == 0x74 && (((byte)pkVar12[-2] | 0x20) == 0x65)))) &&
     (((byte)pkVar12[-1] | 0x20) == 0x73)) {
    for (; (kVar2 = *pkVar12, kVar2 == (kj)0x9 || (kVar2 == (kj)0x20)); pkVar12 = pkVar12 + 1) {
    }
    if (kVar2 == (kj)0x3d) {
      local_78.builder.ptr = (HttpByteRange *)0x0;
      local_78.builder.pos = (HttpByteRange *)0x0;
      local_78.builder.endPtr = (HttpByteRange *)0x0;
      local_78.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
      uVar19 = uVar6 - 1;
      pHVar5 = (HttpByteRange *)0x0;
      bVar3 = false;
      do {
        pkVar18 = pkVar12 + 3;
        pkVar7 = pkVar12 + 1;
        for (pkVar11 = pkVar7; (kVar2 = *pkVar11, kVar2 == (kj)0x9 || (kVar2 == (kj)0x20));
            pkVar11 = pkVar11 + 1) {
          pkVar18 = pkVar18 + 1;
        }
        while ((uVar10 = (uint)(byte)kVar2, kVar2 == (kj)0x9 || (kVar2 == (kj)0x20))) {
          pkVar1 = pkVar11 + 1;
          pkVar11 = pkVar11 + 1;
          pkVar18 = pkVar18 + 1;
          kVar2 = *pkVar1;
        }
        uVar17 = uVar19;
        if ((byte)((char)kVar2 - 0x30U) < 10) {
          uVar13 = 0;
          do {
            pkVar15 = pkVar18;
            uVar13 = (uVar10 + uVar13 * 10) - 0x30;
            pkVar1 = pkVar11 + 1;
            uVar10 = (uint)(byte)*pkVar1;
            pkVar11 = pkVar11 + 1;
            pkVar18 = pkVar15 + 1;
          } while ((byte)((char)*pkVar1 - 0x30U) < 10);
          while (((char)uVar10 == '\t' || (uVar10 == 0x20))) {
            pkVar18 = pkVar11 + 1;
            pkVar11 = pkVar11 + 1;
            pkVar15 = pkVar15 + 1;
            uVar10 = (uint)(byte)*pkVar18;
          }
          if (uVar10 != 0x2d) goto LAB_003e9bac;
          while( true ) {
            kVar2 = *pkVar15;
            uVar10 = (uint)(byte)kVar2;
            if ((kVar2 != (kj)0x9) && (pkVar18 = pkVar15, kVar2 != (kj)0x20)) break;
            pkVar15 = pkVar15 + 1;
          }
          while ((uVar9 = (uint)(byte)kVar2, kVar2 == (kj)0x9 || (uVar9 == 0x20))) {
            kVar2 = pkVar18[1];
            pkVar18 = pkVar18 + 1;
          }
          uVar16 = uVar9;
          if ((byte)((char)kVar2 - 0x30U) < 10) {
            uVar16 = 0;
            pkVar15 = pkVar18;
            do {
              uVar16 = (uVar9 + uVar16 * 10) - 0x30;
              pkVar18 = pkVar15 + 1;
              uVar9 = (uint)(byte)*pkVar18;
              pkVar15 = pkVar15 + 1;
              uVar10 = uVar9;
            } while ((byte)((char)*pkVar18 - 0x30U) < 10);
          }
          while ((kVar8 = SUB41(uVar10,0), kVar8 == (kj)0x20 || (uVar10 == 9))) {
            pkVar18 = pkVar15 + 1;
            pkVar15 = pkVar15 + 1;
            uVar10 = (uint)(byte)*pkVar18;
          }
          if ((byte)((char)kVar2 - 0x30U) < 10) {
            if (uVar16 < uVar13) goto LAB_003e9bac;
            if (uVar6 <= uVar16) {
              uVar16 = (int)value.size_ - 1;
            }
            uVar17 = (ulong)uVar16;
          }
          uVar20 = (ulong)uVar13;
        }
        else {
LAB_003e9bac:
          pkVar15 = pkVar12 + 2;
          for (; (kVar2 = *pkVar7, kVar2 == (kj)0x9 || (kVar2 == (kj)0x20)); pkVar7 = pkVar7 + 1) {
            pkVar15 = pkVar15 + 1;
          }
          if (kVar2 != (kj)0x2d) goto LAB_003e9cdc;
          for (; (kVar2 = *pkVar15, kVar2 == (kj)0x9 || (kVar2 == (kj)0x20)); pkVar15 = pkVar15 + 1)
          {
          }
          while ((uVar10 = (uint)(byte)kVar2, kVar2 == (kj)0x9 || (kVar2 == (kj)0x20))) {
            pkVar12 = pkVar15 + 1;
            pkVar15 = pkVar15 + 1;
            kVar2 = *pkVar12;
          }
          if (9 < (byte)((char)kVar2 - 0x30U)) goto LAB_003e9cdc;
          uVar13 = 0;
          do {
            uVar13 = (uVar10 + uVar13 * 10) - 0x30;
            pkVar12 = pkVar15 + 1;
            uVar10 = (uint)(byte)*pkVar12;
            pkVar15 = pkVar15 + 1;
          } while ((byte)((char)*pkVar12 - 0x30U) < 10);
          while ((kVar8 = SUB41(uVar10,0), kVar8 == (kj)0x20 || (uVar10 == 9))) {
            pkVar12 = pkVar15 + 1;
            pkVar15 = pkVar15 + 1;
            uVar10 = (uint)(byte)*pkVar12;
          }
          uVar20 = 0;
          if (uVar13 <= uVar6) {
            uVar20 = uVar6 - uVar13;
          }
        }
        if ((!bVar3) && (uVar20 <= uVar17)) {
          if ((uVar20 == 0) && (uVar17 == uVar19)) {
            bVar3 = true;
          }
          else {
            if (pHVar5 == local_78.builder.endPtr) {
              newSize = (long)pHVar5 - (long)local_78.builder.ptr >> 3;
              if (pHVar5 == local_78.builder.ptr) {
                newSize = 4;
              }
              local_58 = uVar19;
              Vector<kj::HttpByteRange>::setCapacity(&local_78,newSize);
              pHVar5 = local_78.builder.pos;
              uVar19 = local_58;
            }
            pHVar5->start = uVar20;
            pHVar5->end = uVar17;
            pHVar5 = pHVar5 + 1;
            kVar8 = *pkVar15;
            local_78.builder.pos = pHVar5;
          }
        }
        pkVar12 = pkVar15;
      } while (kVar8 == (kj)0x2c);
      if (pkVar15 == this + (long)local_50) {
        pHVar14 = local_78.builder.ptr;
        if (bVar3) {
          __return_storage_ptr__->tag = 2;
        }
        else if (pHVar5 == local_78.builder.ptr) {
          __return_storage_ptr__->tag = 3;
        }
        else {
          Vector<kj::HttpByteRange>::releaseAsArray(&local_48,&local_78);
          __return_storage_ptr__->tag = 1;
          *(HttpByteRange **)&__return_storage_ptr__->field_1 = local_48.ptr;
          *(size_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_48.size_;
          *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x10) = local_48.disposer;
          local_48.ptr = (HttpByteRange *)0x0;
          local_48.size_ = 0;
          Array<kj::HttpByteRange>::~Array(&local_48);
          pHVar14 = local_78.builder.ptr;
        }
      }
      else {
LAB_003e9cdc:
        __return_storage_ptr__->tag = 3;
        pHVar14 = local_78.builder.ptr;
      }
      pHVar5 = local_78.builder.endPtr;
      pRVar4 = local_78.builder.pos;
      if (pHVar14 == (HttpByteRange *)0x0) {
        return __return_storage_ptr__;
      }
      local_78.builder.ptr = (HttpByteRange *)0x0;
      local_78.builder.pos = (RemoveConst<kj::HttpByteRange> *)0x0;
      local_78.builder.endPtr = (HttpByteRange *)0x0;
      (**(local_78.builder.disposer)->_vptr_ArrayDisposer)
                (local_78.builder.disposer,pHVar14,0x10,(long)pRVar4 - (long)pHVar14 >> 4,
                 (long)pHVar5 - (long)pHVar14 >> 4,0);
      return __return_storage_ptr__;
    }
  }
LAB_003e9d29:
  __return_storage_ptr__->tag = 3;
  return __return_storage_ptr__;
}

Assistant:

HttpRanges tryParseHttpRangeHeader(kj::ArrayPtr<const char> value, uint64_t contentLength) {
  const char* p = value.begin();
  if (!consumeByteRangeUnit(p)) return HttpUnsatisfiableRange {};
  if (*(p++) != '=') return HttpUnsatisfiableRange {};

  auto fullRange = false;
  kj::Vector<HttpByteRange> satisfiableRanges;
  do {
    KJ_IF_SOME(range, consumeRangeSpec(p, contentLength)) {
      // Don't record more ranges if we've already recorded a full range
      if (!fullRange && range.start <= range.end) {
        if (range.start == 0 && range.end == contentLength - 1) {
          // A range evaluated to the full range, but still need to check rest are valid
          fullRange = true;
        } else {
          // "a valid bytes range-spec is satisfiable if it is either:
          // - an int-range with a first-pos that is less than the current length of the selected
          //   representation or
          // - a suffix-range with a non-zero suffix-length"
          satisfiableRanges.add(range);
        }
      }
    } else {
      // If we failed to parse a range, the whole range specification is invalid
      return HttpUnsatisfiableRange {};
    }
  } while (*(p++) == ',');

  if ((--p) != value.end()) return HttpUnsatisfiableRange {};
  if (fullRange) return HttpEverythingRange {};
  // "A valid ranges-specifier is "satisfiable" if it contains at least one range-spec that is
  // satisfiable"
  if (satisfiableRanges.size() == 0) return HttpUnsatisfiableRange {};
  return satisfiableRanges.releaseAsArray();
}